

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O1

void quote_pathname(char *dst,char *src,int dstsize)

{
  int iVar1;
  char cVar2;
  char *pcVar3;
  
  cVar2 = *src;
  if (cVar2 != '\0') {
    pcVar3 = src + 1;
    iVar1 = 0x7ff;
    do {
      if (cVar2 == '/') {
        *dst = '\\';
        dst = dst + 1;
        iVar1 = iVar1 + -1;
LAB_001aa08c:
        *dst = pcVar3[-1];
        dst = dst + 1;
        iVar1 = iVar1 + -1;
      }
      else {
        if (cVar2 != '\\') goto LAB_001aa08c;
        dst[0] = '\\';
        dst[1] = '/';
        dst = dst + 2;
        iVar1 = iVar1 + -2;
      }
      cVar2 = *pcVar3;
    } while ((cVar2 != '\0') && (pcVar3 = pcVar3 + 1, 1 < iVar1));
  }
  *dst = '\0';
  return;
}

Assistant:

static void
quote_pathname(char       *dst,		// O - Destination string
               const char *src,		// I - Source string
	       int        dstsize)	// I - Size of destination string
{
  dstsize--; // prepare for trailing zero

  while (*src && dstsize > 1) {
    if (*src == '\\') {
      // Convert backslash to forward slash...
      *dst++ = '\\';
      *dst++ = '/';
      dstsize -= 2;
      src ++;
    } else {
      if (*src == '/') {
	*dst++ = '\\';
	dstsize--;
      }
      *dst++ = *src++;
      dstsize--;
    }
  }

  *dst = '\0';
}